

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  byte bVar7;
  int iVar8;
  undefined7 extraout_var;
  stbi_uc *psVar9;
  char *pcVar10;
  uchar *puVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint y;
  stbi_uc *psVar17;
  long lVar18;
  uint uVar19;
  byte *pbVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  stbi_uc local_b4 [4];
  stbi_uc *local_b0;
  ulong local_a8;
  ulong local_a0;
  uchar *local_98;
  ulong local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  iVar13 = 0x5c;
  local_7c = req_comp;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    stbi__get8(s);
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  bVar3 = stbi__get8(s);
  bVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  sVar6 = stbi__get8(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00136fb2:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_00137429:
      pcVar10 = "bad file";
      goto LAB_00137442;
    }
  }
  else {
    iVar13 = (*(s->io).eof)(s->io_user_data);
    if (iVar13 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_00136fb2;
      goto LAB_00137429;
    }
  }
  local_a0 = (ulong)bVar3 << 8;
  local_a8 = (ulong)bVar4;
  uVar14 = (int)local_a0 + (uint)bVar4;
  uVar12 = (ulong)uVar14;
  y = (uint)CONCAT11(sVar5,sVar6);
  if ((y == 0) || ((uVar14 <= (uint)(0x7fffffff / (ulong)y) && (y * uVar14 < 0x20000000)))) {
    stbi__get32be(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    uVar21 = 0;
    local_98 = (uchar *)stbi__malloc_mad3(uVar14,y,4,0);
    local_80 = uVar14 * 4;
    local_90 = uVar12;
    memset(local_98,0xff,(ulong)(local_80 * y));
    pbVar20 = (byte *)(local_57 + 1);
    bVar3 = 0;
    do {
      iVar13 = (int)uVar12;
      if (uVar21 == 10) {
LAB_00137432:
        pcVar10 = "bad format";
LAB_00137456:
        *(char **)(in_FS_OFFSET + -0x10) = pcVar10;
        goto LAB_0013746e;
      }
      local_88 = uVar21;
      sVar5 = stbi__get8(s);
      uVar12 = CONCAT71(extraout_var,sVar5) & 0xffffffff;
      iVar13 = (int)CONCAT71(extraout_var,sVar5);
      bVar4 = stbi__get8(s);
      pbVar20[-2] = bVar4;
      bVar7 = stbi__get8(s);
      pbVar20[-1] = bVar7;
      bVar7 = stbi__get8(s);
      *pbVar20 = bVar7;
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001370e5:
        if (s->img_buffer < s->img_buffer_end) goto LAB_001370f9;
LAB_0013744f:
        pcVar10 = "bad file";
        goto LAB_00137456;
      }
      iVar8 = (*(s->io).eof)(s->io_user_data);
      if (iVar8 != 0) {
        if (s->read_from_callbacks != 0) goto LAB_001370e5;
        goto LAB_0013744f;
      }
LAB_001370f9:
      if (bVar4 != 8) goto LAB_00137432;
      bVar3 = bVar3 | bVar7;
      pbVar20 = pbVar20 + 3;
      uVar21 = local_88 + 1;
    } while ((char)uVar12 != '\0');
    iVar13 = 4 - (uint)((bVar3 & 0x10) == 0);
    if (comp != (int *)0x0) {
      *comp = iVar13;
    }
    if (y != 0) {
      local_78 = (ulong)y;
      local_a0 = (ulong)(uint)((int)local_a0 + (int)local_a8);
      uVar12 = 0;
      local_88 = uVar21;
      do {
        local_b0 = local_98 + local_80 * (int)uVar12;
        uVar21 = 0;
        local_70 = uVar12;
        do {
          lVar2 = uVar21 * 3;
          cVar1 = local_57[lVar2];
          iVar8 = (int)local_90;
          local_a8 = uVar21;
          if (cVar1 == '\0') {
            if (iVar8 != 0) {
              bVar3 = local_57[lVar2 + 1];
              uVar12 = local_a0 & 0xffffffff;
              psVar17 = local_b0;
              do {
                psVar9 = stbi__readval(s,(uint)bVar3,psVar17);
                if (psVar9 == (stbi_uc *)0x0) goto LAB_0013746e;
                psVar17 = psVar17 + 4;
                uVar14 = (int)uVar12 - 1;
                uVar12 = (ulong)uVar14;
              } while (uVar14 != 0);
            }
          }
          else if (cVar1 == '\x01') {
            uVar12 = local_90 & 0xffffffff;
            psVar17 = local_b0;
            if (iVar8 != 0) {
LAB_00137311:
              bVar3 = stbi__get8(s);
              if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00137339:
                if (s->img_buffer_end <= s->img_buffer) goto LAB_001374c8;
              }
              else {
                iVar8 = (*(s->io).eof)(s->io_user_data);
                if (iVar8 != 0) {
                  if (s->read_from_callbacks != 0) goto LAB_00137339;
LAB_001374c8:
                  *(char **)(in_FS_OFFSET + -0x10) = "bad file";
                  goto LAB_0013746e;
                }
              }
              psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_b4);
              if (psVar9 == (stbi_uc *)0x0) goto LAB_0013746e;
              uVar16 = (uint)uVar12;
              uVar14 = (uint)bVar3;
              if (uVar16 < bVar3) {
                uVar14 = uVar16;
              }
              uVar15 = uVar14 & 0xff;
              if ((char)uVar14 != '\0') {
                uVar14 = 0;
                do {
                  bVar3 = local_57[lVar2 + 1];
                  uVar19 = 0x80;
                  lVar18 = 0;
                  do {
                    if ((uVar19 & bVar3) != 0) {
                      psVar17[lVar18] = local_b4[lVar18];
                    }
                    lVar18 = lVar18 + 1;
                    uVar19 = uVar19 >> 1;
                  } while (lVar18 != 4);
                  uVar14 = uVar14 + 1;
                  psVar17 = psVar17 + 4;
                } while (uVar14 != uVar15);
              }
              uVar12 = (ulong)(uVar16 - uVar15);
              if (uVar16 - uVar15 == 0 || (int)uVar16 < (int)uVar15) goto LAB_001373e6;
              goto LAB_00137311;
            }
          }
          else {
            if (cVar1 != '\x02') {
              *(char **)(in_FS_OFFSET + -0x10) = "bad format";
              goto LAB_0013746e;
            }
            uVar12 = local_90 & 0xffffffff;
            psVar17 = local_b0;
            if (iVar8 != 0) {
              do {
                bVar3 = stbi__get8(s);
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001371f8:
                  if (s->img_buffer_end <= s->img_buffer) goto LAB_001374c8;
                }
                else {
                  iVar8 = (*(s->io).eof)(s->io_user_data);
                  if (iVar8 != 0) {
                    if (s->read_from_callbacks != 0) goto LAB_001371f8;
                    goto LAB_001374c8;
                  }
                }
                uVar16 = (uint)uVar12;
                uVar14 = (uint)bVar3;
                if ((char)bVar3 < '\0') {
                  if (uVar14 == 0x80) {
                    sVar5 = stbi__get8(s);
                    sVar6 = stbi__get8(s);
                    uVar15 = (uint)CONCAT11(sVar5,sVar6);
                  }
                  else {
                    uVar15 = uVar14 - 0x7f;
                  }
                  if ((int)uVar16 < (int)uVar15) {
                    *(char **)(in_FS_OFFSET + -0x10) = "bad file";
                    goto LAB_0013746e;
                  }
                  psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_b4);
                  if (psVar9 == (stbi_uc *)0x0) goto LAB_0013746e;
                  if (0 < (int)uVar15) {
                    uVar14 = 0;
                    do {
                      bVar3 = local_57[lVar2 + 1];
                      uVar19 = 0x80;
                      lVar18 = 0;
                      do {
                        if ((uVar19 & bVar3) != 0) {
                          psVar17[lVar18] = local_b4[lVar18];
                        }
                        lVar18 = lVar18 + 1;
                        uVar19 = uVar19 >> 1;
                      } while (lVar18 != 4);
                      uVar14 = uVar14 + 1;
                      psVar17 = psVar17 + 4;
                    } while (uVar14 != uVar15);
                  }
                }
                else {
                  uVar15 = bVar3 + 1;
                  uVar19 = uVar15;
                  if (uVar16 <= uVar14) {
                    *(char **)(in_FS_OFFSET + -0x10) = "bad file";
                    goto LAB_0013746e;
                  }
                  do {
                    psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],psVar17);
                    if (psVar9 == (stbi_uc *)0x0) goto LAB_0013746e;
                    psVar17 = psVar17 + 4;
                    uVar19 = uVar19 - 1;
                  } while (uVar19 != 0);
                }
                uVar12 = (ulong)(uVar16 - uVar15);
              } while (uVar16 - uVar15 != 0 && (int)uVar15 <= (int)uVar16);
            }
          }
LAB_001373e6:
          uVar21 = local_a8 + 1;
        } while (local_88 != uVar21);
        uVar12 = local_70 + 1;
      } while (uVar12 != local_78);
    }
    puVar11 = local_98;
    if (local_98 == (uchar *)0x0) {
LAB_0013746e:
      free(local_98);
      puVar11 = (uchar *)0x0;
    }
    *local_68 = (uint)local_90;
    *local_60 = y;
    if (local_7c != 0) {
      iVar13 = local_7c;
    }
    if (local_7c == 0 && comp != (int *)0x0) {
      iVar13 = *comp;
    }
    puVar11 = stbi__convert_format(puVar11,4,iVar13,(uint)local_90,y);
    return puVar11;
  }
  pcVar10 = "too large";
LAB_00137442:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar10;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}